

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsMeshGetDomains(FmsMesh mesh,FmsInt domain_name_id,char **domain_name,FmsInt *num_domains,
                     FmsDomain **domains)

{
  int iVar1;
  
  if (mesh == (FmsMesh)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 2;
    if (domain_name_id < mesh->num_domain_names) {
      if (domain_name != (char **)0x0) {
        *domain_name = mesh->domain_names[domain_name_id];
      }
      if (num_domains != (FmsInt *)0x0) {
        *num_domains = mesh->domain_offsets[domain_name_id + 1] -
                       mesh->domain_offsets[domain_name_id];
      }
      iVar1 = 0;
      if (domains != (FmsDomain **)0x0) {
        *domains = mesh->domains + mesh->domain_offsets[domain_name_id];
        return 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int FmsMeshGetDomains(FmsMesh mesh, FmsInt domain_name_id,
                      const char **domain_name, FmsInt *num_domains,
                      FmsDomain **domains) {
  if (!mesh) { E_RETURN(1); }
  if (domain_name_id >= mesh->num_domain_names) { E_RETURN(2); }
  if (domain_name) { *domain_name = mesh->domain_names[domain_name_id]; }
  if (num_domains) {
    *num_domains = mesh->domain_offsets[domain_name_id+1] -
                   mesh->domain_offsets[domain_name_id];
  }
  if (domains) {
    *domains = mesh->domains + mesh->domain_offsets[domain_name_id];
  }
  return 0;
}